

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::LifetimeTests::details::CheckedProgram::CheckedProgram
          (CheckedProgram *this,RenderContext *renderCtx,GLuint vtxShader,GLuint fragShader)

{
  TestError *this_00;
  char *__to;
  char *__from;
  
  glu::Program::Program(&this->super_Program,renderCtx);
  glu::Program::attachShader(&this->super_Program,vtxShader);
  __from = (char *)(ulong)fragShader;
  glu::Program::attachShader(&this->super_Program,fragShader);
  glu::Program::link(&this->super_Program,__from,__to);
  if ((this->super_Program).m_info.linkOk != false) {
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"getLinkStatus()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
             ,0x7d);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

CheckedProgram	(const RenderContext& renderCtx, GLuint vtxShader, GLuint fragShader)
		: Program	(renderCtx)
	{
		attachShader(vtxShader);
		attachShader(fragShader);
		link();
		TCU_CHECK(getLinkStatus());
	}